

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightsamplers.cpp
# Opt level: O3

void pbrt::anon_class_1_0_00000001::__invoke(StatsAccumulator *accum)

{
  long in_FS_OFFSET;
  
  StatsAccumulator::ReportIntDistribution
            (accum,"Integrator/Lights sampled per lookup",*(int64_t *)(in_FS_OFFSET + -0x10),
             *(int64_t *)(in_FS_OFFSET + -8),*(int64_t *)(in_FS_OFFSET + -0x620),
             *(int64_t *)(in_FS_OFFSET + -0x618));
  *(undefined8 *)(in_FS_OFFSET + -0x10) = 0;
  *(undefined8 *)(in_FS_OFFSET + -8) = 0;
  *(undefined8 *)(in_FS_OFFSET + -0x620) = 0x7fffffffffffffff;
  *(undefined8 *)(in_FS_OFFSET + -0x618) = 0x8000000000000000;
  return;
}

Assistant:

BVHLightSampler::BVHLightSampler(pstd::span<const LightHandle> lights, Allocator alloc)
    : lights(lights.begin(), lights.end(), alloc),
      infiniteLights(alloc),
      nodes(alloc),
      lightToBitTrail(alloc) {
    // Initialize _infiniteLights_ array and light BVH
    std::vector<std::pair<int, LightBounds>> bvhLights;
    for (size_t i = 0; i < lights.size(); ++i) {
        // Partition $i$th light into _infiniteLights_ or _bvhLights_
        LightHandle light = lights[i];
        pstd::optional<LightBounds> lightBounds = light.Bounds();
        if (!lightBounds)
            infiniteLights.push_back(light);
        else if (lightBounds->phi > 0) {
            bvhLights.push_back(std::make_pair(i, *lightBounds));
            allLightBounds = Union(allLightBounds, lightBounds->bounds);
        }
    }
    if (!bvhLights.empty())
        buildBVH(bvhLights, 0, bvhLights.size(), 0, 0, alloc);
    lightBVHBytes += nodes.size() * sizeof(LightBVHNode);
}